

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O2

int wally_aes(uchar *key,size_t key_len,uchar *bytes,size_t bytes_len,uint32_t flags,
             uchar *bytes_out,size_t len)

{
  _Bool _Var1;
  int iVar2;
  AES256_ctx ctx;
  
  _Var1 = are_valid_args(key,key_len,bytes,bytes_len,flags);
  iVar2 = -2;
  if ((((_Var1) && (bytes_len != 0)) && ((((uint)len | (uint)bytes_len) & 0xf) == 0)) &&
     ((bytes_out != (uchar *)0x0 && flags < 4) && len != 0)) {
    if ((flags & 1) == 0) {
      aes_dec(&ctx,key,key_len,bytes,bytes_len,bytes_out);
    }
    else {
      aes_enc(&ctx,key,key_len,bytes,bytes_len,bytes_out);
    }
    wally_clear(&ctx,0xf0);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int wally_aes(const unsigned char *key, size_t key_len,
              const unsigned char *bytes, size_t bytes_len,
              uint32_t flags,
              unsigned char *bytes_out, size_t len)
{
    AES256_ctx ctx;

    if (!are_valid_args(key, key_len, bytes, bytes_len, flags) ||
        len % AES_BLOCK_LEN || !bytes_len || bytes_len % AES_BLOCK_LEN ||
        flags & ~ALL_OPS || !bytes_out || !len)
        return WALLY_EINVAL;

    if (flags & AES_FLAG_ENCRYPT)
        aes_enc(&ctx, key, key_len, bytes, bytes_len, bytes_out);
    else
        aes_dec(&ctx, key, key_len, bytes, bytes_len, bytes_out);

    wally_clear(&ctx, sizeof(ctx));
    return WALLY_OK;
}